

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O0

int min_monster_difficulty(d_level *dlev)

{
  xchar xVar1;
  int zlevel;
  d_level *dlev_local;
  
  xVar1 = level_difficulty(dlev);
  if (((ushort)u.uevent._0_2_ >> 0xd & 1) == 0) {
    dlev_local._4_4_ = (int)xVar1 / 6;
  }
  else {
    dlev_local._4_4_ = (int)xVar1 / 4;
  }
  return dlev_local._4_4_;
}

Assistant:

int min_monster_difficulty(const d_level *dlev)
{
	int zlevel = level_difficulty(dlev);
	if (u.uevent.udemigod) {
	    /* all hell breaks loose */
	    return zlevel / 4;
	} else {
	    return zlevel / 6;
	}
}